

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

DispatchBuilder * __thiscall kern::DispatchBuilder::max_level(DispatchBuilder *this,LogLevel level)

{
  BuilderReuseException *this_00;
  invalid_argument *this_01;
  char in_SIL;
  DispatchBuilder *in_RDI;
  char lvl;
  
  if (in_RDI->inner == (Dispatch *)0x0) {
    this_00 = (BuilderReuseException *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    BuilderReuseException::BuilderReuseException(this_00);
    __cxa_throw(this_00,&BuilderReuseException::typeinfo,
                BuilderReuseException::~BuilderReuseException);
  }
  if ((in_SIL != '\0') && (((int)in_SIL & (int)in_SIL - 1U) == 0)) {
    in_RDI->inner->log_level = in_SIL * '\x02' - Trace;
    in_RDI->inner->is_def_level = false;
    return in_RDI;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"level must not be a combined value");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

DispatchBuilder &DispatchBuilder::max_level(LogLevel level) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        char lvl = static_cast<char>(level);
        if(lvl == 0 || (lvl & (lvl - 1)) != 0)
            throw std::invalid_argument("level must not be a combined value");

        this->inner->log_level = static_cast<LogLevel>((lvl << 1) - 1);
        this->inner->is_def_level = false;

        return *this;
    }